

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

GaussianSet * AllGaussiansForAM(int am)

{
  bool bVar1;
  set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_> *this;
  GaussianSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<Gaussian>,_bool> pVar2;
  array<int,_3UL> *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *__range1;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *v;
  GaussianSet *gs;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_std::array<int,_3UL>_*,_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>
  local_38;
  set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_> *local_30;
  set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_> *local_18;
  undefined1 local_d;
  
  local_d = 0;
  std::set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_>::set
            ((set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_> *)0x113d70);
  this = (set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_> *)
         std::
         map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
         ::at(in_stack_ffffffffffffff90,(key_type *)in_RDI);
  local_30 = this;
  local_18 = this;
  local_38._M_current =
       (array<int,_3UL> *)
       std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::begin
                 (in_stack_ffffffffffffff68);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::end
            (in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::array<int,_3UL>_*,_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            (__normal_iterator<const_std::array<int,_3UL>_*,_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::array<int,_3UL>_*,_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>
    ::operator*(&local_38);
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (size_type)in_stack_ffffffffffffff68);
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (size_type)in_stack_ffffffffffffff68);
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (size_type)in_stack_ffffffffffffff68);
    pVar2 = std::set<Gaussian,_std::less<Gaussian>,_std::allocator<Gaussian>_>::insert
                      (this,(value_type *)in_RDI);
    in_stack_ffffffffffffff77 = pVar2.second;
    __gnu_cxx::
    __normal_iterator<const_std::array<int,_3UL>_*,_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

GaussianSet AllGaussiansForAM(int am)
{
    GaussianSet gs;

    const std::vector<ExpList> & v = gorder_map.at(am);

    for(const auto & it : v)
        gs.insert({it[0], it[1], it[2]});

    return gs;
}